

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O3

bool re2::ParseInteger(StringPiece *s,int *np)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = s->length_;
  if (iVar2 == 0) {
    return false;
  }
  pbVar1 = (byte *)s->ptr_;
  if (9 < *pbVar1 - 0x30) {
    return false;
  }
  if (*pbVar1 == 0x30 && 1 < iVar2) {
    if (pbVar1[1] - 0x30 < 10) {
      return false;
    }
  }
  else if (iVar2 < 1) {
    iVar3 = 0;
    goto LAB_0012fc09;
  }
  iVar2 = iVar2 + 1;
  iVar3 = 0;
  do {
    if (9 < *pbVar1 - 0x30) break;
    if (99999999 < iVar3) {
      return false;
    }
    iVar3 = (uint)*pbVar1 + iVar3 * 10 + -0x30;
    s->ptr_ = (char *)(pbVar1 + 1);
    s->length_ = iVar2 + -2;
    iVar2 = iVar2 + -1;
    pbVar1 = pbVar1 + 1;
  } while (1 < iVar2);
LAB_0012fc09:
  *np = iVar3;
  return true;
}

Assistant:

int size() const { return length_; }